

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.C
# Opt level: O2

char * Utils::strncpy_s(char *dst,size_t sz,char *src,size_t len)

{
  ulong __n;
  
  __n = sz - 1;
  if (len <= sz - 1) {
    __n = len;
  }
  strncpy(dst,src,__n);
  dst[__n] = '\0';
  return dst;
}

Assistant:

char * Utils::strncpy_s(char * dst, size_t sz, char const * src, size_t len)
{
    size_t rlen = std::min<size_t>(sz - 1, len);
#if defined(_WIN32)
    ::strncpy_s(dst, sz, src, rlen);
    return dst;
#else
    char * rval = ::strncpy(dst, src, rlen);
    dst[rlen] = '\0';
    return rval;
#endif
}